

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.hpp
# Opt level: O0

void __thiscall actorpp::RecvThread::run(RecvThread *this)

{
  int __fd;
  uchar *__buf;
  size_type __n;
  ssize_t sVar1;
  int local_48;
  CloseReason local_44;
  int local_40;
  int bytes_read;
  allocator<unsigned_char> local_29;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  RecvThread *this_local;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  do {
    std::allocator<unsigned_char>::allocator(&local_29);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0x80,&local_29);
    std::allocator<unsigned_char>::~allocator(&local_29);
    __fd = this->fd;
    __buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
    __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
    sVar1 = recv(__fd,__buf,__n,0);
    local_40 = (int)sVar1;
    if (local_40 < 1) {
      local_44 = Normal;
      Channel<actorpp::CloseReason>::push<actorpp::CloseReason>(&this->on_close,&local_44);
      local_48 = 3;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,(long)local_40);
      Channel<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
      push<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Channel<std::vector<unsigned_char,std::allocator<unsigned_char>>> *)
                 &this->on_message,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28
                );
      local_48 = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  } while (local_48 == 0);
  return;
}

Assistant:

void run() {
    while (true) {
      std::vector<uint8_t> buf(128);
      int bytes_read = recv(fd, buf.data(), buf.size(), 0);
      if (bytes_read > 0) {
        buf.resize(bytes_read);
        on_message.push(std::move(buf));
      } else {
        on_close.push(CloseReason::Normal);
        break;
      }
    }
  }